

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

TokenStrings * __thiscall
gl4cts::SparseTexture2CommitmentTestCase::createShaderTokens
          (TokenStrings *__return_storage_ptr__,SparseTexture2CommitmentTestCase *this,GLint target,
          GLint format,GLint sample,string *outputBase,string *inputBase)

{
  bool bVar1;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_58 [8];
  string prefix;
  string *outputBase_local;
  GLint local_20;
  GLint sample_local;
  GLint format_local;
  GLint target_local;
  SparseTexture2CommitmentTestCase *this_local;
  TokenStrings *s;
  
  prefix.field_2._M_local_buf[0xf] = '\0';
  outputBase_local._4_4_ = sample;
  local_20 = format;
  sample_local = target;
  _format_local = this;
  this_local = (SparseTexture2CommitmentTestCase *)__return_storage_ptr__;
  TokenStrings::TokenStrings(__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_58);
  if (local_20 == 0x8229) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r8");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8f94) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r8_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x822a) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8f98) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x822b) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg8");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8f95) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg8_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x822c) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg16");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8f99) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg16_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8058) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba8");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x8f97) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba8_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x8059) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgb10_a2");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x906f) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgb10_a2ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x805b) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba16");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x8f9b) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba16_snorm");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x822d) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x822f) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg16f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x881a) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba16f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x822e) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r32f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8230) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg32f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8814) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba32f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  else if (local_20 == 0x8c3a) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r11f_g11f_b10f");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
  }
  else if (local_20 == 0x8231) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r8i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8232) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r8ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8233) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8234) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8235) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r32i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8236) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r32ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8237) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg8i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8238) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg8ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8239) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg16i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x823a) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg16ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x823b) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg32i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x823c) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rg32ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 0, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 1)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8d8e) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba8i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8d7c) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba8ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8d88) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba16i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x8d76) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba16ui");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"u");
  }
  else if (local_20 == 0x8d82) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"rgba32i");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 1, 1, 1)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
    std::__cxx11::string::operator=((string *)local_58,"i");
  }
  else if (local_20 == 0x81a5) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"r16");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->resultExpected,"(1, 0, 0, 0)");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->resultDefault,"(0, 0, 0, 0)")
    ;
  }
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "vec4");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->returnType,(string *)&local_88)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+(&local_c8,"u",outputBase);
  std::operator+(&local_a8,&local_c8,"2D");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->outputType,(string *)&local_a8)
  ;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 inputBase);
  std::operator+(&local_e8,&local_108,"2D");
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->inputType,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec2");
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->pointDef,"gl_WorkGroupID.x, gl_WorkGroupID.y");
  bVar1 = std::operator==(&__return_storage_ptr__->returnType,"vec4");
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->epsilon,"0.008");
  }
  else {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->epsilon,"0");
  }
  if (sample_local == 0xde0) {
    std::operator+(&local_148,"u",outputBase);
    std::operator+(&local_128,&local_148,"2D");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_168,&local_188,"1D");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"int");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointDef,"gl_WorkGroupID.x");
  }
  else if (sample_local == 0x8c18) {
    std::operator+(&local_1c8,"u",outputBase);
    std::operator+(&local_1a8,&local_1c8,"2D_ARRAY");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::operator+(&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_1e8,&local_208,"1DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec2");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,"gl_WorkGroupID.x, gl_WorkGroupID.z");
  }
  else if (sample_local == 0x8c1a) {
    std::operator+(&local_248,"u",outputBase);
    std::operator+(&local_228,&local_248,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::operator+(&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_268,&local_288,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec3");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z");
  }
  else if (sample_local == 0x806f) {
    std::operator+(&local_2c8,"u",outputBase);
    std::operator+(&local_2a8,&local_2c8,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::operator+(&local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_2e8,&local_308,"3D");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec3");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z");
  }
  else if (sample_local == 0x8513) {
    std::operator+(&local_348,"u",outputBase);
    std::operator+(&local_328,&local_348,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::operator+(&local_388,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_368,&local_388,"Cube");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec3");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6");
  }
  else if (sample_local == 0x9009) {
    std::operator+(&local_3c8,"u",outputBase);
    std::operator+(&local_3a8,&local_3c8,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::operator+(&local_408,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_3e8,&local_408,"CubeArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec3");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z");
  }
  else if (sample_local == 0x84f5) {
    std::operator+(&local_448,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_428,&local_448,"2DRect");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
  }
  else if (sample_local == 0x9100) {
    std::operator+(&local_488,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_468,&local_488,"2DMS");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    de::toString<int>(&local_4c8,(int *)((long)&outputBase_local + 4));
    std::operator+(&local_4a8,", ",&local_4c8);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->sampleDef,(string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
  }
  else if (sample_local == 0x9102) {
    std::operator+(&local_508,"u",outputBase);
    std::operator+(&local_4e8,&local_508,"2DArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->outputType,(string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::operator+(&local_548,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   inputBase);
    std::operator+(&local_528,&local_548,"2DMSArray");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->inputType,(string *)&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->pointType,"ivec3");
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->pointDef,
               "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z");
    de::toString<int>(&local_588,(int *)((long)&outputBase_local + 4));
    std::operator+(&local_568,", ",&local_588);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->sampleDef,(string *)&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::__cxx11::string::~string((string *)&local_588);
  }
  prefix.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_58);
  if ((prefix.field_2._M_local_buf[0xf] & 1U) == 0) {
    TokenStrings::~TokenStrings(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

SparseTexture2CommitmentTestCase::TokenStrings SparseTexture2CommitmentTestCase::createShaderTokens(
	GLint target, GLint format, GLint sample, const std::string outputBase, const std::string inputBase)
{
	TokenStrings s;
	std::string  prefix;

	if (format == GL_R8)
	{
		s.format		 = "r8";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8_SNORM)
	{
		s.format		 = "r8_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R16_SNORM)
	{
		s.format		 = "r16_snorm";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8)
	{
		s.format		 = "rg8";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG8_SNORM)
	{
		s.format		 = "rg8_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16)
	{
		s.format		 = "rg16";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16_SNORM)
	{
		s.format		 = "rg16_snorm";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA8)
	{
		s.format		 = "rgba8";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA8_SNORM)
	{
		s.format		 = "rgba8_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2)
	{
		s.format		 = "rgb10_a2";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGB10_A2UI)
	{
		s.format		 = "rgb10_a2ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16)
	{
		s.format		 = "rgba16";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_RGBA16_SNORM)
	{
		s.format		 = "rgba16_snorm";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R16F)
	{
		s.format		 = "r16f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG16F)
	{
		s.format		 = "rg16f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA16F)
	{
		s.format		 = "rgba16f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R32F)
	{
		s.format		 = "r32f";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RG32F)
	{
		s.format		 = "rg32f";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_RGBA32F)
	{
		s.format		 = "rgba32f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}
	else if (format == GL_R11F_G11F_B10F)
	{
		s.format		 = "r11f_g11f_b10f";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
	}
	else if (format == GL_R8I)
	{
		s.format		 = "r8i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R8UI)
	{
		s.format		 = "r8ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R16I)
	{
		s.format		 = "r16i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R16UI)
	{
		s.format		 = "r16ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_R32I)
	{
		s.format		 = "r32i";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_R32UI)
	{
		s.format		 = "r32ui";
		s.resultExpected = "(1, 0, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG8I)
	{
		s.format		 = "rg8i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG8UI)
	{
		s.format		 = "rg8ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG16I)
	{
		s.format		 = "rg16i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG16UI)
	{
		s.format		 = "rg16ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RG32I)
	{
		s.format		 = "rg32i";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "i";
	}
	else if (format == GL_RG32UI)
	{
		s.format		 = "rg32ui";
		s.resultExpected = "(1, 1, 0, 1)";
		s.resultDefault  = "(0, 0, 0, 1)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA8I)
	{
		s.format		 = "rgba8i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA8UI)
	{
		s.format		 = "rgba8ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA16I)
	{
		s.format		 = "rgba16i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_RGBA16UI)
	{
		s.format		 = "rgba16ui";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "u";
	}
	else if (format == GL_RGBA32I)
	{
		s.format		 = "rgba32i";
		s.resultExpected = "(1, 1, 1, 1)";
		s.resultDefault  = "(0, 0, 0, 0)";
		prefix			 = "i";
	}
	else if (format == GL_DEPTH_COMPONENT16)
	{
		s.format		 = "r16";
		s.resultExpected = "(1, 0, 0, 0)";
		s.resultDefault  = "(0, 0, 0, 0)";
	}

	s.returnType = prefix + "vec4";
	s.outputType = "u" + outputBase + "2D";
	s.inputType  = prefix + inputBase + "2D";
	s.pointType  = "ivec2";
	s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y";

	if (s.returnType == "vec4")
		s.epsilon = "0.008";
	else
		s.epsilon = "0";

	if (target == GL_TEXTURE_1D)
	{
		s.outputType = "u" + outputBase + "2D";
		s.inputType  = prefix + inputBase + "1D";
		s.pointType  = "int";
		s.pointDef   = "gl_WorkGroupID.x";
	}
	else if (target == GL_TEXTURE_1D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2D_ARRAY";
		s.inputType  = prefix + inputBase + "1DArray";
		s.pointType  = "ivec2";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_2D_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_3D)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "3D";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_CUBE_MAP)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "Cube";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z % 6";
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "CubeArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
	}
	else if (target == GL_TEXTURE_RECTANGLE)
	{
		s.inputType = prefix + inputBase + "2DRect";
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE)
	{
		s.inputType = prefix + inputBase + "2DMS";
		s.sampleDef = ", " + de::toString(sample);
	}
	else if (target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		s.outputType = "u" + outputBase + "2DArray";
		s.inputType  = prefix + inputBase + "2DMSArray";
		s.pointType  = "ivec3";
		s.pointDef   = "gl_WorkGroupID.x, gl_WorkGroupID.y, gl_WorkGroupID.z";
		s.sampleDef  = ", " + de::toString(sample);
	}

	return s;
}